

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O2

el_action_t ce_inc_search(EditLine *el,wchar_t dir)

{
  size_t sVar1;
  byte bVar2;
  el_action_t eVar3;
  wchar_t wVar4;
  wchar_t *pwVar5;
  void *pvVar6;
  wchar_t *pwVar7;
  byte bVar8;
  size_t sVar9;
  uint uVar10;
  wchar_t *pwVar11;
  ulong uVar12;
  el_action_t eVar13;
  bool bVar14;
  bool bVar15;
  wchar_t ch;
  wchar_t local_54;
  wchar_t *local_50;
  wchar_t local_48;
  wchar_t local_44;
  long local_40;
  long local_38;
  
  bVar2 = ce_inc_search_pchar;
  sVar1 = (el->el_search).patlen;
  if ((el->el_line).limit <= (el->el_line).lastchar + sVar1 + 6) {
    return '\x06';
  }
  local_50 = (el->el_line).cursor;
  local_54 = (el->el_history).eventno;
  bVar14 = dir == L'\x18';
  local_48 = L'\x7fffffff';
  if (bVar14) {
    local_48 = L'\0';
  }
  local_38 = (ulong)bVar14 * 0x10 + 0x50;
  local_40 = (-(ulong)bVar14 | 1) << 2;
  local_44 = dir;
LAB_0010e547:
  sVar9 = (el->el_search).patlen;
  if (sVar9 == 0) {
    ce_inc_search_pchar = 0;
    pwVar5 = (el->el_search).patbuf;
    *pwVar5 = L'.';
    (el->el_search).patlen = 2;
    pwVar5[1] = L'*';
    sVar9 = 2;
  }
  pwVar5 = (el->el_line).lastchar;
  *pwVar5 = L'\n';
  pwVar11 = L"fwd";
  if (dir == L'\x18') {
    pwVar11 = L"bck";
  }
  pwVar7 = pwVar5 + 2;
  pwVar5 = pwVar5 + 3;
  for (; wVar4 = *pwVar11, wVar4 != L'\0'; pwVar11 = pwVar11 + 1) {
    (el->el_line).lastchar = pwVar7;
    pwVar7[-1] = wVar4;
    pwVar7 = pwVar7 + 1;
    pwVar5 = pwVar5 + 1;
  }
  uVar10 = (uint)ce_inc_search_pchar;
  (el->el_line).lastchar = pwVar7;
  pwVar7[-1] = uVar10 * 5 + L':';
  pwVar11 = (el->el_search).patbuf;
  for (pwVar7 = pwVar11 + 2; pwVar7 < pwVar11 + sVar9; pwVar7 = pwVar7 + 1) {
    wVar4 = *pwVar7;
    (el->el_line).lastchar = pwVar5;
    pwVar5[-1] = wVar4;
    pwVar5 = pwVar5 + 1;
  }
  pwVar5[-1] = L'\0';
  re_refresh(el);
  wVar4 = el_wgetc(el,&ch);
  if (wVar4 != L'\x01') {
    eVar3 = ed_end_of_file(el,0);
    return eVar3;
  }
  eVar3 = (el->el_map).current[(uint)(ch & 0xff)];
  if (eVar3 == '\x04') {
LAB_0010e699:
    if ((el->el_search).patlen < 3) {
LAB_0010e713:
      terminal_beep(el);
      goto LAB_0010e71b;
    }
    bVar14 = true;
    eVar3 = '\0';
    goto LAB_0010e720;
  }
  if (eVar3 == '\x06') {
LAB_0010e64d:
    uVar12 = (el->el_search).patlen;
    if (0x3fd < uVar12) goto LAB_0010e713;
    (el->el_search).patlen = uVar12 + 1;
    (el->el_search).patbuf[uVar12] = ch;
    pwVar5 = (el->el_line).lastchar;
    (el->el_line).lastchar = pwVar5 + 1;
    *pwVar5 = ch;
    pwVar5[1] = L'\0';
    goto LAB_0010e68c;
  }
  bVar8 = 1;
  if (eVar3 == '&') {
    dir = L'\x18';
  }
  else {
    if (eVar3 == '\"') goto LAB_0010e699;
    if (eVar3 != '%') {
      if (eVar3 == '\t') goto LAB_0010e64d;
      bVar14 = true;
      if (ch == L'\a') {
        eVar3 = '\x06';
      }
      else {
        if (ch != L'\x1b') {
          if (ch == L'\x17') {
            pwVar5 = (el->el_search).patbuf;
            sVar9 = (el->el_search).patlen;
            pwVar11 = pwVar5 + 2;
            do {
              if (pwVar5 + sVar9 <= pwVar11) {
                pwVar5 = (el->el_line).cursor;
                if (pwVar5 == (el->el_line).buffer) goto LAB_0010e71b;
                pwVar5 = pwVar5 + (sVar9 - 3);
                (el->el_line).cursor = pwVar5;
                pwVar11 = c__next_word(pwVar5,(el->el_line).lastchar,L'\x01',ce__isword);
                pwVar5 = (el->el_line).cursor;
                goto LAB_0010ea07;
              }
              pvVar6 = memchr("*[]?",*pwVar11,5);
              pwVar11 = pwVar11 + 1;
            } while (pvVar6 == (void *)0x0);
            goto LAB_0010e713;
          }
          ce_inc_search::endcmd[0] = ch;
          el_wpush(el,ce_inc_search::endcmd);
        }
        eVar3 = '\x04';
      }
      goto LAB_0010e720;
    }
    dir = L'\x17';
  }
  eVar3 = '\0';
  bVar14 = false;
  goto LAB_0010e722;
LAB_0010ea07:
  if ((pwVar11 <= pwVar5) || (wVar4 = *pwVar5, wVar4 == L'\n')) goto LAB_0010ea5d;
  uVar12 = (el->el_search).patlen;
  if (uVar12 < 0x3fe) {
    (el->el_search).patlen = uVar12 + 1;
    (el->el_search).patbuf[uVar12] = wVar4;
    (el->el_line).cursor = pwVar5 + 1;
    wVar4 = *pwVar5;
    pwVar7 = (el->el_line).lastchar;
    (el->el_line).lastchar = pwVar7 + 1;
    *pwVar7 = wVar4;
    pwVar5 = pwVar5 + 1;
    goto LAB_0010ea07;
  }
  terminal_beep(el);
LAB_0010ea5d:
  (el->el_line).cursor = local_50;
  *(el->el_line).lastchar = L'\0';
LAB_0010e68c:
  re_refresh(el);
LAB_0010e71b:
  eVar3 = '\0';
  bVar14 = false;
LAB_0010e720:
  bVar8 = 0;
LAB_0010e722:
  pwVar5 = (el->el_line).buffer;
  pwVar11 = (el->el_line).lastchar;
  while ((pwVar5 < pwVar11 && (*pwVar11 != L'\n'))) {
    (el->el_line).lastchar = pwVar11 + -1;
    *pwVar11 = L'\0';
    pwVar11 = pwVar11 + -1;
  }
  *pwVar11 = L'\0';
  if (!bVar14) {
    pwVar7 = (el->el_search).patbuf;
    uVar12 = (el->el_search).patlen;
    ch = L']';
    pwVar11 = pwVar7 + uVar12;
    do {
      pwVar11 = pwVar11 + -1;
      if (pwVar11 < pwVar7 + 2) {
        bVar15 = true;
        goto LAB_0010e79c;
      }
      wVar4 = *pwVar11;
    } while ((wVar4 != L']') && (wVar4 != L'['));
    bVar15 = wVar4 != L'[';
    ch = wVar4;
LAB_0010e79c:
    if ((2 < uVar12) && (bVar15)) {
      if ((bool)(bVar8 & dir == local_44)) {
        if (ce_inc_search_pchar == 1) {
          (el->el_history).eventno = local_48;
          eVar3 = hist_get(el);
          if (eVar3 == '\x06') {
            hist_get(el);
          }
          pwVar11 = *(wchar_t **)((long)&el->el_prog + local_38);
          (el->el_line).cursor = pwVar11;
          pwVar7 = (el->el_search).patbuf;
          uVar12 = (el->el_search).patlen;
          pwVar5 = (el->el_line).buffer;
        }
        else {
          pwVar11 = (wchar_t *)((long)(el->el_line).cursor + local_40);
          (el->el_line).cursor = pwVar11;
        }
      }
      else {
        pwVar11 = (el->el_line).cursor;
      }
      pwVar7[uVar12] = L'.';
      (el->el_search).patlen = uVar12 + 2;
      pwVar7[uVar12 + 1] = L'*';
      pwVar7[uVar12 + 2] = L'\0';
      if (((pwVar11 < pwVar5) || ((el->el_line).lastchar < pwVar11)) ||
         (eVar3 = ce_search_line(el,dir), eVar3 == '\x06')) {
        (el->el_state).lastcmd = (el_action_t)dir;
        if (dir == L'\x18') {
          eVar3 = ed_search_prev_history(el,0);
        }
        else {
          eVar3 = ed_search_next_history(el,0);
        }
        if (eVar3 == '\x06') {
          sVar9 = (el->el_search).patlen;
          (el->el_search).patlen = sVar9 - 2;
          (el->el_search).patbuf[sVar9 - 2] = L'\0';
          terminal_beep(el);
          if ((el->el_history).eventno != local_54) {
            (el->el_history).eventno = local_54;
            eVar3 = hist_get(el);
            if (eVar3 == '\x06') {
              return '\x06';
            }
          }
          (el->el_line).cursor = local_50;
          ce_inc_search_pchar = 1;
          goto LAB_0010e90d;
        }
        (el->el_line).cursor =
             *(wchar_t **)((long)((el->el_tty).t_t + -2) + 0x20 + (ulong)(dir == L'\x18') * 0x10);
        ce_search_line(el,dir);
      }
      sVar9 = (el->el_search).patlen;
      (el->el_search).patlen = sVar9 - 2;
      (el->el_search).patbuf[sVar9 - 2] = L'\0';
      ce_inc_search_pchar = 0;
    }
LAB_0010e90d:
    eVar3 = ce_inc_search(el,dir);
    bVar15 = false;
    eVar13 = '\0';
    if (((eVar3 != '\x06' | bVar2 | ~ce_inc_search_pchar) & 1) == 0) goto LAB_0010e95b;
  }
  if (eVar3 == '\0') {
    bVar15 = false;
    eVar13 = '\0';
  }
  else {
    if (sVar1 != 0) {
      return eVar3;
    }
    if (eVar3 != '\x06') {
      return eVar3;
    }
    eVar13 = '\x06';
    bVar15 = true;
  }
LAB_0010e95b:
  ce_inc_search_pchar = bVar2 & 1;
  (el->el_search).patlen = sVar1;
  if ((el->el_history).eventno != local_54) {
    (el->el_history).eventno = local_54;
    eVar3 = hist_get(el);
    if (eVar3 == '\x06') {
      return '\x06';
    }
  }
  (el->el_line).cursor = local_50;
  if (bVar15) {
    re_refresh(el);
    return '\x06';
  }
  if (bVar14) {
    return eVar13;
  }
  goto LAB_0010e547;
}

Assistant:

libedit_private el_action_t
ce_inc_search(EditLine *el, int dir)
{
	static const wchar_t STRfwd[] = L"fwd", STRbck[] = L"bck";
	static wchar_t pchar = L':';  /* ':' = normal, '?' = failed */
	static wchar_t endcmd[2] = {'\0', '\0'};
	wchar_t *ocursor = el->el_line.cursor, oldpchar = pchar, ch;
	const wchar_t *cp;

	el_action_t ret = CC_NORM;

	int ohisteventno = el->el_history.eventno;
	size_t oldpatlen = el->el_search.patlen;
	int newdir = dir;
	int done, redo;

	if (el->el_line.lastchar + sizeof(STRfwd) /
	    sizeof(*el->el_line.lastchar) + 2 +
	    el->el_search.patlen >= el->el_line.limit)
		return CC_ERROR;

	for (;;) {

		if (el->el_search.patlen == 0) {	/* first round */
			pchar = ':';
#ifdef ANCHOR
#define	LEN	2
			el->el_search.patbuf[el->el_search.patlen++] = '.';
			el->el_search.patbuf[el->el_search.patlen++] = '*';
#else
#define	LEN	0
#endif
		}
		done = redo = 0;
		*el->el_line.lastchar++ = '\n';
		for (cp = (newdir == ED_SEARCH_PREV_HISTORY) ? STRbck : STRfwd;
		    *cp; *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar++ = pchar;
		for (cp = &el->el_search.patbuf[LEN];
		    cp < &el->el_search.patbuf[el->el_search.patlen];
		    *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar = '\0';
		re_refresh(el);

		if (el_wgetc(el, &ch) != 1)
			return ed_end_of_file(el, 0);

		switch (el->el_map.current[(unsigned char) ch]) {
		case ED_INSERT:
		case ED_DIGIT:
			if (el->el_search.patlen >= EL_BUFSIZ - LEN)
				terminal_beep(el);
			else {
				el->el_search.patbuf[el->el_search.patlen++] =
				    ch;
				*el->el_line.lastchar++ = ch;
				*el->el_line.lastchar = '\0';
				re_refresh(el);
			}
			break;

		case EM_INC_SEARCH_NEXT:
			newdir = ED_SEARCH_NEXT_HISTORY;
			redo++;
			break;

		case EM_INC_SEARCH_PREV:
			newdir = ED_SEARCH_PREV_HISTORY;
			redo++;
			break;

		case EM_DELETE_PREV_CHAR:
		case ED_DELETE_PREV_CHAR:
			if (el->el_search.patlen > LEN)
				done++;
			else
				terminal_beep(el);
			break;

		default:
			switch (ch) {
			case 0007:	/* ^G: Abort */
				ret = CC_ERROR;
				done++;
				break;

			case 0027:	/* ^W: Append word */
			/* No can do if globbing characters in pattern */
				for (cp = &el->el_search.patbuf[LEN];; cp++)
				    if (cp >= &el->el_search.patbuf[
					el->el_search.patlen]) {
					if (el->el_line.cursor ==
					    el->el_line.buffer)
						break;
					el->el_line.cursor +=
					    el->el_search.patlen - LEN - 1;
					cp = c__next_word(el->el_line.cursor,
					    el->el_line.lastchar, 1,
					    ce__isword);
					while (el->el_line.cursor < cp &&
					    *el->el_line.cursor != '\n') {
						if (el->el_search.patlen >=
						    EL_BUFSIZ - LEN) {
							terminal_beep(el);
							break;
						}
						el->el_search.patbuf[el->el_search.patlen++] =
						    *el->el_line.cursor;
						*el->el_line.lastchar++ =
						    *el->el_line.cursor++;
					}
					el->el_line.cursor = ocursor;
					*el->el_line.lastchar = '\0';
					re_refresh(el);
					break;
				    } else if (isglob(*cp)) {
					    terminal_beep(el);
					    break;
				    }
				break;

			default:	/* Terminate and execute cmd */
				endcmd[0] = ch;
				el_wpush(el, endcmd);
				/* FALLTHROUGH */

			case 0033:	/* ESC: Terminate */
				ret = CC_REFRESH;
				done++;
				break;
			}
			break;
		}

		while (el->el_line.lastchar > el->el_line.buffer &&
		    *el->el_line.lastchar != '\n')
			*el->el_line.lastchar-- = '\0';
		*el->el_line.lastchar = '\0';

		if (!done) {

			/* Can't search if unmatched '[' */
			for (cp = &el->el_search.patbuf[el->el_search.patlen-1],
			    ch = L']';
			    cp >= &el->el_search.patbuf[LEN];
			    cp--)
				if (*cp == '[' || *cp == ']') {
					ch = *cp;
					break;
				}
			if (el->el_search.patlen > LEN && ch != L'[') {
				if (redo && newdir == dir) {
					if (pchar == '?') { /* wrap around */
						el->el_history.eventno =
						    newdir == ED_SEARCH_PREV_HISTORY ? 0 : 0x7fffffff;
						if (hist_get(el) == CC_ERROR)
							/* el->el_history.event
							 * no was fixed by
							 * first call */
							(void) hist_get(el);
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
					} else
						el->el_line.cursor +=
						    newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    -1 : 1;
				}
#ifdef ANCHOR
				el->el_search.patbuf[el->el_search.patlen++] =
				    '.';
				el->el_search.patbuf[el->el_search.patlen++] =
				    '*';
#endif
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (el->el_line.cursor < el->el_line.buffer ||
				    el->el_line.cursor > el->el_line.lastchar ||
				    (ret = ce_search_line(el, newdir))
				    == CC_ERROR) {
					/* avoid c_setpat */
					el->el_state.lastcmd =
					    (el_action_t) newdir;
					ret = (el_action_t)
					    (newdir == ED_SEARCH_PREV_HISTORY ?
					    ed_search_prev_history(el, 0) :
					    ed_search_next_history(el, 0));
					if (ret != CC_ERROR) {
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
						(void) ce_search_line(el,
						    newdir);
					}
				}
				el->el_search.patlen -= LEN;
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (ret == CC_ERROR) {
					terminal_beep(el);
					if (el->el_history.eventno !=
					    ohisteventno) {
						el->el_history.eventno =
						    ohisteventno;
						if (hist_get(el) == CC_ERROR)
							return CC_ERROR;
					}
					el->el_line.cursor = ocursor;
					pchar = '?';
				} else {
					pchar = ':';
				}
			}
			ret = ce_inc_search(el, newdir);

			if (ret == CC_ERROR && pchar == '?' && oldpchar == ':')
				/*
				 * break abort of failed search at last
				 * non-failed
				 */
				ret = CC_NORM;

		}
		if (ret == CC_NORM || (ret == CC_ERROR && oldpatlen == 0)) {
			/* restore on normal return or error exit */
			pchar = oldpchar;
			el->el_search.patlen = oldpatlen;
			if (el->el_history.eventno != ohisteventno) {
				el->el_history.eventno = ohisteventno;
				if (hist_get(el) == CC_ERROR)
					return CC_ERROR;
			}
			el->el_line.cursor = ocursor;
			if (ret == CC_ERROR)
				re_refresh(el);
		}
		if (done || ret != CC_NORM)
			return ret;
	}
}